

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  undefined8 *puVar1;
  float fVar2;
  pointer paVar3;
  pointer paVar4;
  size_t sVar5;
  Value *this_00;
  pointer paVar6;
  aiVector3D *paVar7;
  undefined8 uVar8;
  uint32 uVar9;
  DataArrayList *pDVar10;
  ulong *puVar11;
  aiVector3D *paVar12;
  aiColor4D *paVar13;
  aiMesh *paVar14;
  uint *puVar15;
  runtime_error *prVar16;
  ulong uVar17;
  aiFace *paVar18;
  DataArrayList *pDVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  Value **ppVVar26;
  ulong uVar27;
  bool bVar28;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  if (node == (DDLNode *)0x0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"No parent node for name.","");
    std::runtime_error::runtime_error(prVar16,(string *)local_50);
    *(undefined ***)prVar16 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (this->m_currentMesh == (aiMesh *)0x0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"No current mesh for index data found.","");
    std::runtime_error::runtime_error(prVar16,(string *)local_50);
    *(undefined ***)prVar16 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pDVar10 = ODDLParser::DDLNode::getDataArrayList(node);
  if (pDVar10 != (DataArrayList *)0x0) {
    bVar28 = pDVar10->m_dataList != (Value *)0x0;
    lVar25 = -8;
    uVar23 = 0;
    uVar20 = 0;
    pDVar19 = pDVar10;
    do {
      uVar23 = uVar23 + (uint)bVar28 * 3;
      lVar25 = lVar25 + (ulong)bVar28 * -0x10;
      uVar20 = uVar20 + bVar28;
      pDVar19 = pDVar19->m_next;
    } while (pDVar19 != (DataArrayList *)0x0);
    this->m_currentMesh->mNumFaces = (uint)uVar20;
    puVar11 = (ulong *)operator_new__(-(ulong)(uVar20 >> 0x3c != 0) | -lVar25);
    *puVar11 = uVar20;
    if (uVar20 != 0) {
      paVar18 = (aiFace *)(puVar11 + 1);
      do {
        paVar18->mNumIndices = 0;
        paVar18->mIndices = (uint *)0x0;
        paVar18 = paVar18 + 1;
      } while ((aiFace *)((long)puVar11 - lVar25) != paVar18);
    }
    this->m_currentMesh->mFaces = (aiFace *)(puVar11 + 1);
    this->m_currentMesh->mNumVertices = uVar23;
    paVar14 = this->m_currentMesh;
    uVar27 = (ulong)paVar14->mNumVertices;
    uVar20 = uVar27 * 0xc;
    paVar12 = (aiVector3D *)operator_new__(uVar20);
    if (uVar27 != 0) {
      memset(paVar12,0,((uVar20 - 0xc) / 0xc) * 0xc + 0xc);
    }
    paVar14->mVertices = paVar12;
    uVar20 = (this->m_currentVertices).m_numColors;
    if (uVar20 != 0) {
      uVar27 = 0xffffffffffffffff;
      if (uVar20 < 0x1000000000000000) {
        uVar27 = uVar20 << 4;
      }
      paVar13 = (aiColor4D *)operator_new__(uVar27);
      memset(paVar13,0,uVar20 << 4);
      this->m_currentMesh->mColors[0] = paVar13;
    }
    paVar3 = (this->m_currentVertices).m_normals.
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    paVar4 = (this->m_currentVertices).m_normals.
             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (paVar3 != paVar4) {
      paVar14 = this->m_currentMesh;
      uVar21 = (ulong)paVar14->mNumVertices;
      uVar27 = uVar21 * 0xc;
      paVar12 = (aiVector3D *)operator_new__(uVar27);
      if (uVar21 != 0) {
        memset(paVar12,0,((uVar27 - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar14->mNormals = paVar12;
    }
    sVar5 = (this->m_currentVertices).m_numUVComps[0];
    if (sVar5 != 0) {
      paVar14 = this->m_currentMesh;
      uVar21 = (ulong)paVar14->mNumVertices;
      uVar27 = uVar21 * 0xc;
      paVar12 = (aiVector3D *)operator_new__(uVar27);
      if (uVar21 != 0) {
        memset(paVar12,0,((uVar27 - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar14->mTextureCoords[0] = paVar12;
    }
    paVar14 = this->m_currentMesh;
    if (paVar14->mNumFaces != 0) {
      uVar27 = 0;
      uVar23 = 0;
      do {
        paVar18 = paVar14->mFaces;
        paVar18[uVar27].mNumIndices = 3;
        puVar15 = (uint *)operator_new__(0xc);
        paVar18[uVar27].mIndices = puVar15;
        if (paVar18[uVar27].mNumIndices != 0) {
          ppVVar26 = &pDVar10->m_dataList;
          uVar21 = (ulong)uVar23;
          lVar24 = uVar21 * 3 + 2;
          lVar25 = uVar21 << 4;
          uVar22 = 0;
          do {
            this_00 = *ppVVar26;
            uVar9 = ODDLParser::Value::getUnsignedInt32(this_00);
            uVar17 = (ulong)(int)uVar9;
            paVar6 = (this->m_currentVertices).m_vertices.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((ulong)(((long)(this->m_currentVertices).m_vertices.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)paVar6 >> 2) *
                       -0x5555555555555555) < uVar17) {
              __assert_fail("static_cast<size_t>( idx ) <= m_currentVertices.m_vertices.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                            ,0x3a4,
                            "void Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode(ODDLParser::DDLNode *, aiScene *)"
                           );
            }
            if ((ulong)this->m_currentMesh->mNumVertices <= uVar21 + uVar22) {
              __assert_fail("index < m_currentMesh->mNumVertices",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/OpenGEX/OpenGEXImporter.cpp"
                            ,0x3a5,
                            "void Assimp::OpenGEX::OpenGEXImporter::handleIndexArrayNode(ODDLParser::DDLNode *, aiScene *)"
                           );
            }
            paVar12 = this->m_currentMesh->mVertices;
            fVar2 = paVar6[uVar17].z;
            *(undefined8 *)((long)paVar12 + lVar24 * 4 + -8) = *(undefined8 *)(paVar6 + uVar17);
            (&paVar12->x)[lVar24] = fVar2;
            if (uVar20 != 0) {
              paVar13 = (this->m_currentVertices).m_colors + uVar17;
              uVar8 = *(undefined8 *)&paVar13->b;
              puVar1 = (undefined8 *)((long)&this->m_currentMesh->mColors[0]->r + lVar25);
              *puVar1 = *(undefined8 *)paVar13;
              puVar1[1] = uVar8;
            }
            if (paVar3 != paVar4) {
              paVar6 = (this->m_currentVertices).m_normals.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              paVar12 = this->m_currentMesh->mNormals;
              fVar2 = paVar6[uVar17].z;
              *(undefined8 *)((long)paVar12 + lVar24 * 4 + -8) = *(undefined8 *)(paVar6 + uVar17);
              (&paVar12->x)[lVar24] = fVar2;
            }
            if (sVar5 != 0) {
              paVar12 = (this->m_currentVertices).m_textureCoords[0];
              paVar7 = this->m_currentMesh->mTextureCoords[0];
              fVar2 = paVar12[uVar17].z;
              *(undefined8 *)((long)paVar7 + lVar24 * 4 + -8) = *(undefined8 *)(paVar12 + uVar17);
              (&paVar7->x)[lVar24] = fVar2;
            }
            paVar18[uVar27].mIndices[uVar22] = uVar23 + (int)uVar22;
            ppVVar26 = &this_00->m_next;
            uVar22 = uVar22 + 1;
            lVar24 = lVar24 + 3;
            lVar25 = lVar25 + 0x10;
          } while (uVar22 < paVar18[uVar27].mNumIndices);
          uVar23 = uVar23 + (int)uVar22;
        }
        pDVar10 = pDVar10->m_next;
        uVar27 = uVar27 + 1;
        paVar14 = this->m_currentMesh;
      } while (uVar27 < paVar14->mNumFaces);
    }
  }
  return;
}

Assistant:

void OpenGEXImporter::handleIndexArrayNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    if( nullptr == m_currentMesh ) {
        throw DeadlyImportError( "No current mesh for index data found." );
        return;
    }

    DataArrayList *vaList = node->getDataArrayList();
    if( nullptr == vaList ) {
        return;
    }

    const size_t numItems( countDataArrayListItems( vaList ) );
    m_currentMesh->mNumFaces = static_cast<unsigned int>(numItems);
    m_currentMesh->mFaces = new aiFace[ numItems ];
    m_currentMesh->mNumVertices = static_cast<unsigned int>(numItems * 3);
    m_currentMesh->mVertices = new aiVector3D[ m_currentMesh->mNumVertices ];
    bool hasColors( false );
    if ( m_currentVertices.m_numColors > 0 ) {
        m_currentMesh->mColors[0] = new aiColor4D[ m_currentVertices.m_numColors ];
        hasColors = true;
    }
    bool hasNormalCoords( false );
    if ( !m_currentVertices.m_normals.empty() ) {
        m_currentMesh->mNormals = new aiVector3D[ m_currentMesh->mNumVertices ];
        hasNormalCoords = true;
    }
    bool hasTexCoords( false );
    if ( m_currentVertices.m_numUVComps[ 0 ] > 0 ) {
        m_currentMesh->mTextureCoords[ 0 ] = new aiVector3D[ m_currentMesh->mNumVertices ];
        hasTexCoords = true;
    }

    unsigned int index( 0 );
    for( size_t i = 0; i < m_currentMesh->mNumFaces; i++ ) {
        aiFace &current(  m_currentMesh->mFaces[ i ] );
        current.mNumIndices = 3;
        current.mIndices = new unsigned int[ current.mNumIndices ];
        Value *next( vaList->m_dataList );
        for( size_t indices = 0; indices < current.mNumIndices; indices++ ) {
            const int idx( next->getUnsignedInt32() );
            ai_assert( static_cast<size_t>( idx ) <= m_currentVertices.m_vertices.size() );
            ai_assert( index < m_currentMesh->mNumVertices );
            aiVector3D &pos = ( m_currentVertices.m_vertices[ idx ] );
            m_currentMesh->mVertices[ index ].Set( pos.x, pos.y, pos.z );
            if ( hasColors ) {
                aiColor4D &col = m_currentVertices.m_colors[ idx ];
                m_currentMesh->mColors[ 0 ][ index ] = col;
            }
            if ( hasNormalCoords ) {
                aiVector3D &normal = ( m_currentVertices.m_normals[ idx ] );
                m_currentMesh->mNormals[ index ].Set( normal.x, normal.y, normal.z );
            }
            if ( hasTexCoords ) {
                aiVector3D &tex = ( m_currentVertices.m_textureCoords[ 0 ][ idx ] );
                m_currentMesh->mTextureCoords[ 0 ][ index ].Set( tex.x, tex.y, tex.z );
            }
            current.mIndices[ indices ] = index;
            index++;

            next = next->m_next;
        }
        vaList = vaList->m_next;
    }
}